

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasNotSet::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  string value;
  FlagSaver FStack_128;
  string local_120;
  string local_100;
  CommandLineFlagInfo local_e0;
  
  FlagSaver::FlagSaver(&FStack_128);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameExistsAndWasNotSet");
  SetCommandLineOptionWithMode_abi_cxx11_(&local_100,(gflags *)0x150845,"800",(char *)0x2,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  paVar1 = &local_120.field_2;
  local_120.field_2._M_allocated_capacity._0_7_ = 0x6562206c6c6977;
  local_120.field_2._M_local_buf[7] = ' ';
  local_120.field_2._8_7_ = 0x6465676e616863;
  local_120._M_string_length = 0xf;
  local_120.field_2._M_local_buf[0xf] = '\0';
  local_120._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = GetCommandLineOption("test_int32",&local_120);
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_120);
    if (iVar3 == 0) {
      GetCommandLineFlagInfoOrDie(&local_e0,"test_int32");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.filename._M_dataplus._M_p != &local_e0.filename.field_2) {
        operator_delete(local_e0.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.default_value._M_dataplus._M_p != &local_e0.default_value.field_2) {
        operator_delete(local_e0.default_value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.current_value._M_dataplus._M_p != &local_e0.current_value.field_2) {
        operator_delete(local_e0.current_value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.description._M_dataplus._M_p != &local_e0.description.field_2) {
        operator_delete(local_e0.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.type._M_dataplus._M_p != &local_e0.type.field_2) {
        operator_delete(local_e0.type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.name._M_dataplus._M_p != &local_e0.name.field_2) {
        operator_delete(local_e0.name._M_dataplus._M_p);
      }
      if (local_e0.is_default != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        FlagSaver::~FlagSaver(&FStack_128);
        return;
      }
      goto LAB_00137f3f;
    }
  }
  else {
    _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasNotSet::Run();
  }
  _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasNotSet::Run();
LAB_00137f3f:
  _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasNotSet::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&FStack_128);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasNotSet) {
  // This doesn't set the flag's value, but rather its default value.
  // is_default is still true, but the 'default' value returned has changed!
  SetCommandLineOptionWithMode("test_int32", "800", SET_FLAGS_DEFAULT);
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("800", value);
  EXPECT_TRUE(GetCommandLineFlagInfoOrDie("test_int32").is_default);
}